

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void PurgeWord2000Attributes(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  int iVar2;
  TidyAttrId TVar3;
  uint uVar4;
  AttVal *pAVar5;
  ctmbstr s1;
  AttVal *av;
  AttVal *pAVar6;
  
  if (node->attributes != (AttVal *)0x0) {
    av = node->attributes;
    pAVar6 = (AttVal *)0x0;
    do {
      pAVar1 = av->next;
      pAVar5 = av;
      if (av->dict == (Attribute *)0x0) {
LAB_0014ac12:
        if ((av->attribute != (ctmbstr)0x0) &&
           (iVar2 = prvTidytmbstrncmp(av->attribute,"x:",2), iVar2 == 0)) {
LAB_0014ac35:
          pAVar5 = pAVar6;
          if (pAVar6 == (AttVal *)0x0) {
            pAVar5 = (AttVal *)&node->attributes;
          }
          pAVar5->next = pAVar1;
          prvTidyFreeAttribute(doc,av);
          pAVar5 = pAVar6;
        }
      }
      else {
        TVar3 = av->dict->id;
        if (TVar3 != TidyAttr_CLASS) {
LAB_0014abd4:
          if ((int)TVar3 < 0x91) {
            if (TVar3 == TidyAttr_HEIGHT) {
LAB_0014abf5:
              if (((node->tag == (Dict *)0x0) || (uVar4 = node->tag->id - TidyTag_TD, 6 < uVar4)) ||
                 ((0x49U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_0014ac12;
            }
            else if (TVar3 != TidyAttr_LANG) goto LAB_0014ac12;
          }
          else if (TVar3 != TidyAttr_STYLE) {
            if (TVar3 != TidyAttr_WIDTH) goto LAB_0014ac12;
            goto LAB_0014abf5;
          }
          goto LAB_0014ac35;
        }
        if (av->value == (ctmbstr)0x0) {
          s1 = (ctmbstr)0x0;
LAB_0014abaf:
          iVar2 = prvTidytmbstrncmp(s1,"Mso",3);
          if (iVar2 == 0) {
            if (av->dict != (Attribute *)0x0) {
              TVar3 = av->dict->id;
              if (TVar3 != TidyAttr_CLASS) goto LAB_0014abd4;
              goto LAB_0014ac35;
            }
            goto LAB_0014ac12;
          }
        }
        else {
          iVar2 = prvTidytmbstrcasecmp(av->value,"Code");
          if (iVar2 != 0) {
            s1 = av->value;
            goto LAB_0014abaf;
          }
        }
      }
      av = pAVar1;
      pAVar6 = pAVar5;
    } while (pAVar1 != (AttVal *)0x0);
  }
  return;
}

Assistant:

static void PurgeWord2000Attributes( TidyDocImpl* doc, Node* node )
{
    AttVal *attr, *next, *prev = NULL;

    for ( attr = node->attributes; attr; attr = next )
    {
        next = attr->next;

        /* special check for class="Code" denoting pre text */
        /* Pass thru user defined styles as HTML class names */
        if (attrIsCLASS(attr))
        {
            if (AttrValueIs(attr, "Code") ||
                 TY_(tmbstrncmp)(attr->value, "Mso", 3) != 0 )
            {
                prev = attr;
                continue;
            }
        }

        if (attrIsCLASS(attr) ||
            attrIsSTYLE(attr) ||
            attrIsLANG(attr)  ||
             ( (attrIsHEIGHT(attr) || attrIsWIDTH(attr)) &&
               (nodeIsTD(node) || nodeIsTR(node) || nodeIsTH(node)) ) ||
             (attr->attribute && TY_(tmbstrncmp)(attr->attribute, "x:", 2) == 0) )
        {
            if (prev)
                prev->next = next;
            else
                node->attributes = next;

            TY_(FreeAttribute)( doc, attr );
        }
        else
            prev = attr;
    }
}